

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkRevoluteSpherical.cpp
# Opt level: O3

void __thiscall
chrono::ChLinkRevoluteSpherical::ArchiveIN(ChLinkRevoluteSpherical *this,ChArchiveIn *marchive)

{
  ChFunctorArchiveInSpecific<chrono::ChVector<double>_> specFuncA;
  char *local_58;
  double *local_50;
  undefined1 local_48;
  undefined **local_40;
  ChVector<double> *local_38;
  
  ChArchiveIn::VersionRead<chrono::ChLinkRevoluteSpherical>(marchive);
  ChLink::ArchiveIN(&this->super_ChLink,marchive);
  local_38 = &this->m_pos1;
  local_58 = "m_pos1";
  local_48 = 0;
  local_40 = &PTR__ChFunctorArchiveIn_00b03258;
  local_50 = (double *)&local_40;
  (**(code **)(*(long *)marchive + 0x60))(marchive,&local_58);
  local_38 = &this->m_pos2;
  local_40 = &PTR__ChFunctorArchiveIn_00b03258;
  local_58 = "m_pos2";
  local_48 = 0;
  local_50 = (double *)&local_40;
  (**(code **)(*(long *)marchive + 0x60))(marchive,&local_58);
  local_38 = &this->m_dir1;
  local_40 = &PTR__ChFunctorArchiveIn_00b03258;
  local_58 = "m_dir1";
  local_48 = 0;
  local_50 = (double *)&local_40;
  (**(code **)(*(long *)marchive + 0x60))(marchive,&local_58);
  local_50 = &this->m_dist;
  local_58 = "m_dist";
  local_48 = 0;
  (**(code **)(*(long *)marchive + 0x20))(marchive,&local_58);
  return;
}

Assistant:

void ChLinkRevoluteSpherical::ArchiveIN(ChArchiveIn& marchive) {
    // version number
    /*int version =*/ marchive.VersionRead<ChLinkRevoluteSpherical>();

    // deserialize parent class
    ChLink::ArchiveIN(marchive);

    // deserialize all member data:
    marchive >> CHNVP(m_pos1);
    marchive >> CHNVP(m_pos2);
    marchive >> CHNVP(m_dir1);
    marchive >> CHNVP(m_dist);
}